

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QCommonArrayOps<QString>::appendIteratorRange<QSet<QString>::const_iterator>
          (QCommonArrayOps<QString> *this,const_iterator b,const_iterator e,
          IfIsForwardIterator<QSet<QString>::const_iterator> param_3)

{
  qsizetype *pqVar1;
  long lVar2;
  Data *pDVar3;
  ulong uVar4;
  long lVar5;
  long *plVar6;
  long lVar7;
  Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *this_00;
  QString *pQVar8;
  
  plVar6 = b.i.i.bucket;
  this_00 = b.i.i.d;
  lVar5 = *(long *)this_00;
  uVar4 = this_00->size;
  if ((lVar5 != *plVar6) || (uVar4 != plVar6[1])) {
    pQVar8 = (this->super_Type).super_QGenericArrayOps<QString>.super_QArrayDataPointer<QString>.ptr
             + (this->super_Type).super_QGenericArrayOps<QString>.super_QArrayDataPointer<QString>.
               size;
    do {
      lVar7 = (uVar4 >> 7) * 0x90;
      lVar2 = *(long *)(*(long *)(lVar5 + 0x20) + 0x80 + lVar7);
      uVar4 = (ulong)*(byte *)((ulong)((uint)uVar4 & 0x7f) + *(long *)(lVar5 + 0x20) + lVar7);
      pDVar3 = *(Data **)(lVar2 + uVar4 * 0x18);
      (pQVar8->d).d = pDVar3;
      (pQVar8->d).ptr = *(char16_t **)(lVar2 + 8 + uVar4 * 0x18);
      (pQVar8->d).size = *(qsizetype *)(lVar2 + 0x10 + uVar4 * 0x18);
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pqVar1 = &(this->super_Type).super_QGenericArrayOps<QString>.super_QArrayDataPointer<QString>.
                size;
      *pqVar1 = *pqVar1 + 1;
      QHashPrivate::iterator<QHashPrivate::Node<QString,_QHashDummyValue>_>::operator++
                ((iterator<QHashPrivate::Node<QString,_QHashDummyValue>_> *)this_00);
      lVar5 = *(long *)this_00;
      uVar4 = this_00->size;
      pQVar8 = pQVar8 + 1;
    } while ((lVar5 != *plVar6) || (uVar4 != plVar6[1]));
  }
  return;
}

Assistant:

void appendIteratorRange(It b, It e, QtPrivate::IfIsForwardIterator<It> = true)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        const qsizetype distance = std::distance(b, e);
        Q_ASSERT(distance >= 0 && distance <= this->allocatedCapacity() - this->size);
        Q_UNUSED(distance);

#if __cplusplus >= 202002L && defined(__cpp_concepts) && defined(__cpp_lib_concepts)
        constexpr bool canUseCopyAppend =
                std::contiguous_iterator<It> &&
                std::is_same_v<
                    std::remove_cv_t<typename std::iterator_traits<It>::value_type>,
                    T
                >;
        if constexpr (canUseCopyAppend) {
            this->copyAppend(std::to_address(b), std::to_address(e));
        } else
#endif
        {
            T *iter = this->end();
            for (; b != e; ++iter, ++b) {
                new (iter) T(*b);
                ++this->size;
            }
        }
    }